

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindow * ImGui::FindWindowByName(char *name)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 IVar3;
  long lVar4;
  long lVar5;
  
  pIVar2 = GImGui;
  IVar3 = ImHash(name,0,0);
  lVar4 = (long)(pIVar2->Windows).Size;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      pIVar1 = (pIVar2->Windows).Data[lVar5];
      if (pIVar1->ID == IVar3) {
        return pIVar1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

ImGuiWindow* ImGui::FindWindowByName(const char* name)
{
    // FIXME-OPT: Store sorted hashes -> pointers so we can do a bissection in a contiguous block
    ImGuiContext& g = *GImGui;
    ImGuiID id = ImHash(name, 0);
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i]->ID == id)
            return g.Windows[i];
    return NULL;
}